

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Diligent::GLSLangUtils::anon_unknown_4::CompileShaderInternal
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          TShader *Shader,EShMessages messages,Includer *pIncluder,char *ShaderSource,
          size_t SourceCodeLen,bool AssignBindings,EProfile shProfile,IDataBlob **ppCompilerOutput)

{
  uint uVar1;
  EShLanguage stage;
  char *pcVar2;
  char *pcVar3;
  TIntermediate *intermediate;
  char *__to;
  bool local_409;
  undefined1 local_3e0 [8];
  TProgram Program;
  undefined1 local_1e0 [7];
  bool ParseResult;
  TBuiltInResource Resources;
  bool AssignBindings_local;
  size_t SourceCodeLen_local;
  char *ShaderSource_local;
  Includer *pIncluder_local;
  EShMessages messages_local;
  TShader *Shader_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv;
  
  Resources.limits.generalVariableIndexing = AssignBindings;
  unique0x1000028d = SourceCodeLen;
  glslang::TShader::setAutoMapBindings(Shader,true);
  glslang::TShader::setAutoMapLocations(Shader,true);
  InitResources();
  if (pIncluder == (Includer *)0x0) {
    local_409 = glslang::TShader::parse
                          (Shader,(TBuiltInResource *)local_1e0,100,shProfile,false,false,messages);
  }
  else {
    local_409 = glslang::TShader::parse
                          (Shader,(TBuiltInResource *)local_1e0,100,shProfile,false,false,messages,
                           pIncluder);
  }
  Program._503_1_ = local_409;
  if (local_409 == false) {
    pcVar2 = glslang::TShader::getInfoLog(Shader);
    pcVar3 = glslang::TShader::getInfoDebugLog(Shader);
    LogCompilerError("Failed to parse shader source: \n",pcVar2,pcVar3,ShaderSource,
                     stack0xffffffffffffffc8,ppCompilerOutput);
    memset(__return_storage_ptr__,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  }
  else {
    glslang::TProgram::TProgram((TProgram *)local_3e0);
    glslang::TProgram::addShader((TProgram *)local_3e0,Shader);
    uVar1 = glslang::TProgram::link((TProgram *)local_3e0,(char *)(ulong)messages,__to);
    if ((uVar1 & 1) == 0) {
      pcVar2 = glslang::TProgram::getInfoLog((TProgram *)local_3e0);
      pcVar3 = glslang::TProgram::getInfoDebugLog((TProgram *)local_3e0);
      LogCompilerError("Failed to link program: \n",pcVar2,pcVar3,ShaderSource,
                       stack0xffffffffffffffc8,ppCompilerOutput);
      memset(__return_storage_ptr__,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
    }
    else {
      if ((Resources.limits.generalVariableIndexing & 1U) != 0) {
        glslang::TProgram::mapIO((TProgram *)local_3e0,(TIoMapResolver *)0x0,(TIoMapper *)0x0);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
      stage = glslang::TShader::getStage(Shader);
      intermediate = glslang::TProgram::getIntermediate((TProgram *)local_3e0,stage);
      glslang::GlslangToSpv(intermediate,__return_storage_ptr__,(SpvOptions *)0x0);
    }
    glslang::TProgram::~TProgram((TProgram *)local_3e0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> CompileShaderInternal(::glslang::TShader&           Shader,
                                                EShMessages                   messages,
                                                ::glslang::TShader::Includer* pIncluder,
                                                const char*                   ShaderSource,
                                                size_t                        SourceCodeLen,
                                                bool                          AssignBindings,
                                                ::EProfile                    shProfile,
                                                IDataBlob**                   ppCompilerOutput)
{
    Shader.setAutoMapBindings(true);
    Shader.setAutoMapLocations(true);
    TBuiltInResource Resources = InitResources();

    auto ParseResult = pIncluder != nullptr ?
        Shader.parse(&Resources, 100, shProfile, false, false, messages, *pIncluder) :
        Shader.parse(&Resources, 100, shProfile, false, false, messages);
    if (!ParseResult)
    {
        LogCompilerError("Failed to parse shader source: \n", Shader.getInfoLog(), Shader.getInfoDebugLog(), ShaderSource, SourceCodeLen, ppCompilerOutput);
        return {};
    }

    ::glslang::TProgram Program;
    Program.addShader(&Shader);
    if (!Program.link(messages))
    {
        LogCompilerError("Failed to link program: \n", Program.getInfoLog(), Program.getInfoDebugLog(), ShaderSource, SourceCodeLen, ppCompilerOutput);
        return {};
    }

    // This step is essential to set bindings and descriptor sets
    if (AssignBindings)
        Program.mapIO();

    std::vector<unsigned int> spirv;
    ::glslang::GlslangToSpv(*Program.getIntermediate(Shader.getStage()), spirv);

    return spirv;
}